

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

v5 * fmt::v5::vformat_abi_cxx11_(wstring_view format_str,wformat_args args)

{
  wformat_args args_00;
  wstring_view format_str_00;
  size_t in_RDX;
  undefined8 in_stack_fffffffffffff778;
  undefined8 in_stack_fffffffffffff780;
  wformat_args local_858;
  wchar_t *local_848;
  size_t sStack_840;
  allocator<wchar_t> local_821;
  undefined1 local_820 [8];
  wmemory_buffer buffer;
  wformat_args args_local;
  wstring_view format_str_local;
  
  std::allocator<wchar_t>::allocator();
  basic_memory_buffer<wchar_t,_500UL,_std::allocator<wchar_t>_>::basic_memory_buffer
            ((basic_memory_buffer<wchar_t,_500UL,_std::allocator<wchar_t>_> *)local_820,&local_821);
  std::allocator<wchar_t>::~allocator(&local_821);
  local_848 = (wchar_t *)format_str.size_;
  sStack_840 = in_RDX;
  wformat_args::wformat_args<fmt::v5::wformat_args&>
            (&local_858,(wformat_args *)(buffer.store_ + 0x1f2));
  format_str_00.size_ = sStack_840;
  format_str_00.data_ = local_848;
  args_00._8_8_ = in_stack_fffffffffffff780;
  args_00._0_8_ = in_stack_fffffffffffff778;
  vformat_to((wbuffer *)local_820,format_str_00,args_00);
  to_string<wchar_t,500ul>
            ((v5 *)format_str.data_,
             (basic_memory_buffer<wchar_t,_500UL,_std::allocator<wchar_t>_> *)local_820);
  basic_memory_buffer<wchar_t,_500UL,_std::allocator<wchar_t>_>::~basic_memory_buffer
            ((basic_memory_buffer<wchar_t,_500UL,_std::allocator<wchar_t>_> *)local_820);
  return (v5 *)format_str.data_;
}

Assistant:

inline std::wstring vformat(wstring_view format_str, wformat_args args) {
  wmemory_buffer buffer;
  vformat_to(buffer, format_str, args);
  return to_string(buffer);
}